

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_225::Inlining::run(Inlining *this,Module *module_)

{
  NameInfoMap *this_00;
  Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
  *this_01;
  Index IVar1;
  uint uVar2;
  mapped_type mVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  pointer puVar7;
  Global *pGVar8;
  pointer puVar9;
  pointer ppEVar10;
  pointer puVar11;
  DataSegment *pDVar12;
  pointer puVar13;
  Export *pEVar14;
  FunctionSplitter *pFVar15;
  pointer pIVar16;
  IString name_00;
  pointer pNVar17;
  bool bVar18;
  mapped_type *pmVar19;
  FunctionSplitter *pFVar20;
  Function *pFVar21;
  size_type sVar22;
  mapped_type *pmVar23;
  size_type sVar24;
  mapped_type *pmVar25;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar26;
  pointer puVar27;
  Function *pFVar28;
  size_type *psVar29;
  ElementSegment *pEVar30;
  Module *pMVar31;
  ulong uVar32;
  __node_base_ptr p_Var33;
  pointer action;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  pointer ppEVar34;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar35;
  pointer puVar36;
  pointer puVar37;
  PassRunner *pPVar38;
  __node_base *p_Var39;
  undefined1 local_2e0 [8];
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  iterationCounts;
  undefined1 auStack_298 [8];
  FunctionInfoScanner scanner;
  InliningState state;
  unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
  inlinedInto;
  undefined1 auStack_c8 [8];
  Name name;
  vector<wasm::Name,_std::allocator<wasm::Name>_> funcNames;
  undefined1 auStack_98 [8];
  Name inlinedName;
  Function *local_78;
  Function *func_2;
  Function *inlinedFunction;
  vector<wasm::Name,_std::allocator<wasm::Name>_> splitNames;
  
  this->module = module_;
  puVar4 = (module_->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar5 = (module_->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_2e0 = (undefined1  [8])&iterationCounts._M_h._M_rehash_policy._M_next_resize;
  iterationCounts._M_h._M_buckets = (__buckets_ptr)0x1;
  iterationCounts._M_h._M_bucket_count = 0;
  iterationCounts._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  iterationCounts._M_h._M_element_count._0_4_ = 0x3f800000;
  iterationCounts._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  iterationCounts._M_h._M_rehash_policy._4_4_ = 0;
  iterationCounts._M_h._M_rehash_policy._M_next_resize = 0;
  this_00 = &this->infos;
  uVar32 = 0;
LAB_008733b7:
  if (uVar32 <= (ulong)((long)puVar4 - (long)puVar5 >> 3)) {
    uVar32 = (ulong)((int)uVar32 + 1);
    state.actionsForFunction._M_h._M_single_bucket =
         (__node_base_ptr)&inlinedInto._M_h._M_rehash_policy._M_next_resize;
    inlinedInto._M_h._M_buckets = (__buckets_ptr)0x1;
    inlinedInto._M_h._M_bucket_count = 0;
    inlinedInto._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    inlinedInto._M_h._M_element_count._0_4_ = 0x3f800000;
    inlinedInto._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    inlinedInto._M_h._M_rehash_policy._4_4_ = 0;
    inlinedInto._M_h._M_rehash_policy._M_next_resize = 0;
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&this_00->_M_h);
    puVar6 = (this->module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar27 = (this->module->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar27 != puVar6;
        puVar27 = puVar27 + 1) {
      std::
      unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
      ::operator[](this_00,(key_type *)
                           (puVar27->_M_t).
                           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                           .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    }
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .super_Pass._vptr_Pass = (_func_int **)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .super_Pass.name._M_dataplus._M_p = (pointer)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .super_Pass.name._M_string_length._0_4_ =
         (uint)scanner.
               super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
               .super_Pass.name._M_string_length & 0xffffff00;
    this_01 = (Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
               *)(&scanner.
                   super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
                   .super_Pass.name.field_2._M_allocated_capacity + 1);
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .super_Pass.name.field_2._8_8_ = 0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .replacep = (Expression **)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .stack.fixed._M_elems[9].currp = (Expression **)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .currFunction = (Function *)0x0;
    auStack_298 = (undefined1  [8])&PTR__WalkerPass_00e1ee18;
    pMVar31 = this->module;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .super_Pass.runner =
         (PassRunner *)
         &scanner.
          super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
          .super_Pass.name._M_string_length;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .currModule = (Module *)this_00;
    Pass::setPassRunner((Pass *)auStack_298,(this->super_Pass).runner);
    (*(code *)(((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split>_>_>
                 *)((long)auStack_298 + 0x10))->_M_h)._M_buckets)((Pass *)auStack_298,pMVar31);
    pMVar31 = this->module;
    puVar7 = (pMVar31->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .currFunction = (Function *)pMVar31;
    for (puVar35 = (pMVar31->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar35 != puVar7;
        puVar35 = puVar35 + 1) {
      pGVar8 = (puVar35->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if ((pGVar8->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk(this_01,&pGVar8->init);
      }
    }
    puVar9 = (pMVar31->elementSegments).
             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar36 = (pMVar31->elementSegments).
                   super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar36 != puVar9;
        puVar36 = puVar36 + 1) {
      pEVar30 = (puVar36->_M_t).
                super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      if (pEVar30->offset != (Expression *)0x0) {
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk(this_01,&pEVar30->offset);
        pEVar30 = (puVar36->_M_t).
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      }
      ppEVar10 = (pEVar30->data).
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      for (ppEVar34 = (pEVar30->data).
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppEVar34 != ppEVar10;
          ppEVar34 = ppEVar34 + 1) {
        scanner.infos = (NameInfoMap *)*ppEVar34;
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk(this_01,(Expression **)&scanner.infos);
      }
    }
    puVar11 = (pMVar31->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar37 = (pMVar31->dataSegments).
                   super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar37 != puVar11;
        puVar37 = puVar37 + 1) {
      pDVar12 = (puVar37->_M_t).
                super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                _M_t.
                super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if (pDVar12->offset != (Expression *)0x0) {
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk(this_01,&pDVar12->offset);
      }
    }
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
    .currFunction = (Function *)0x0;
    WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    ::~WalkerPass((WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
                   *)auStack_298);
    puVar13 = (this->module->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar26 = (this->module->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar26 != puVar13;
        puVar26 = puVar26 + 1) {
      pEVar14 = (puVar26->_M_t).
                super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if (pEVar14->kind == Function) {
        pmVar19 = std::
                  unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                  ::operator[](this_00,&pEVar14->value);
        pmVar19->usedGlobally = true;
      }
    }
    pMVar31 = this->module;
    if ((pMVar31->start).super_IString.str._M_str != (char *)0x0) {
      pMVar31 = (Module *)&pMVar31->start;
      pmVar19 = std::
                unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                ::operator[](this_00,(key_type *)pMVar31);
      pmVar19->usedGlobally = true;
    }
    pPVar38 = (this->super_Pass).runner;
    if ((2 < (pPVar38->options).optimizeLevel) && ((pPVar38->options).shrinkLevel == 0)) {
      pFVar20 = (FunctionSplitter *)operator_new(0x48);
      pFVar20->module = this->module;
      pFVar20->options = &pPVar38->options;
      (pFVar20->splits)._M_h._M_buckets = &(pFVar20->splits)._M_h._M_single_bucket;
      (pFVar20->splits)._M_h._M_bucket_count = 1;
      (pFVar20->splits)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (pFVar20->splits)._M_h._M_element_count = 0;
      (pFVar20->splits)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      auStack_298 = (undefined1  [8])0x0;
      (pFVar20->splits)._M_h._M_rehash_policy._M_next_resize = 0;
      (pFVar20->splits)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      pFVar15 = (this->functionSplitter)._M_t.
                super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                .super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>.
                _M_head_impl;
      (this->functionSplitter)._M_t.
      super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
      ._M_t.
      super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
      .super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>._M_head_impl =
           pFVar20;
      if (pFVar15 != (FunctionSplitter *)0x0) {
        std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>::operator()
                  ((default_delete<wasm::(anonymous_namespace)::FunctionSplitter> *)pFVar15,
                   (FunctionSplitter *)pMVar31);
      }
      std::
      unique_ptr<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
      ::~unique_ptr((unique_ptr<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                     *)auStack_298);
    }
    scanner.infos = (NameInfoMap *)&state.worthInlining._M_h._M_rehash_policy._M_next_resize;
    state.worthInlining._M_h._M_buckets = (__buckets_ptr)0x1;
    state.worthInlining._M_h._M_bucket_count = 0;
    state.worthInlining._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    state.worthInlining._M_h._M_element_count._0_4_ = 0x3f800000;
    state.worthInlining._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    state.worthInlining._M_h._M_rehash_policy._4_4_ = 0;
    state.worthInlining._M_h._M_rehash_policy._M_next_resize = 0;
    state.worthInlining._M_h._M_single_bucket =
         (__node_base_ptr)&state.actionsForFunction._M_h._M_rehash_policy._M_next_resize;
    state.actionsForFunction._M_h._M_buckets = (__buckets_ptr)0x1;
    state.actionsForFunction._M_h._M_bucket_count = 0;
    state.actionsForFunction._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    state.actionsForFunction._M_h._M_element_count._0_4_ = 0x3f800000;
    state.actionsForFunction._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    state.actionsForFunction._M_h._M_rehash_policy._4_4_ = 0;
    state.actionsForFunction._M_h._M_rehash_policy._M_next_resize = 0;
    puVar6 = (this->module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar27 = (this->module->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar27 != puVar6;
        puVar27 = puVar27 + 1) {
      pFVar28 = (puVar27->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if ((pFVar28->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
        auStack_298 = *(undefined1 (*) [8])&(pFVar28->super_Importable).super_Named;
        scanner.
        super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
        .super_Pass._vptr_Pass =
             (_func_int **)(pFVar28->super_Importable).super_Named.name.super_IString.str._M_str;
        name_00.str = *(string_view *)&(pFVar28->super_Importable).super_Named;
        pmVar19 = std::
                  unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                  ::operator[](this_00,(key_type *)auStack_298);
        bVar18 = FunctionInfo::worthInlining(pmVar19,&((this->super_Pass).runner)->options);
        if (bVar18) {
LAB_00873722:
          std::__detail::
          _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)&scanner.infos,(value_type *)pFVar28);
        }
        else {
          pFVar15 = (this->functionSplitter)._M_t.
                    super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                    .super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>.
                    _M_head_impl;
          if (pFVar15 != (FunctionSplitter *)0x0) {
            pFVar21 = Module::getFunction(this->module,(Name)name_00.str);
            bVar18 = canHandleParams(pFVar21);
            if ((bVar18) &&
               (bVar18 = FunctionSplitter::maybeSplit(pFVar15,pFVar21,(Function **)0x0), bVar18))
            goto LAB_00873722;
          }
        }
      }
    }
    if (state.worthInlining._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      name.super_IString.str._M_str = (char *)0x0;
      puVar6 = (this->module->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar27 = (this->module->functions).
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar27 != puVar6;
          puVar27 = puVar27 + 1) {
        std::
        unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
        ::operator[]((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                      *)&state.worthInlining._M_h._M_single_bucket,
                     (key_type *)
                     (puVar27->_M_t).
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
        std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                  ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&name.super_IString.str._M_str
                   ,(value_type *)
                    (puVar27->_M_t).
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
      }
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass._vptr_Pass = (_func_int **)0x0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.name._M_dataplus._M_p = (pointer)0x0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.name._M_string_length._0_4_ =
           (uint)scanner.
                 super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
                 .super_Pass.name._M_string_length & 0xffffff00;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.name.field_2._8_8_ = 0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .replacep = (Expression **)0x0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .stack.fixed._M_elems[9].currp = (Expression **)0x0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .currFunction = (Function *)0x0;
      auStack_298 = (undefined1  [8])&PTR__WalkerPass_00e1ee70;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
      .currModule = (Module *)&scanner.infos;
      pMVar31 = this->module;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.runner =
           (PassRunner *)
           &scanner.
            super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
            .super_Pass.name._M_string_length;
      Pass::setPassRunner((Pass *)auStack_298,(this->super_Pass).runner);
      (**(_func_int **)((long)auStack_298 + 0x10))
                ((WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
                  *)auStack_298,pMVar31);
      WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
      ::~WalkerPass((WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
                     *)auStack_298);
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass._vptr_Pass = (_func_int **)0x1;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.runner = (PassRunner *)0x0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.name._M_dataplus._M_p = (pointer)0x0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.name._M_string_length._0_4_ = 0x3f800000;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.name.field_2._M_allocated_capacity = 0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.name.field_2._8_8_ = 0;
      inlinedInto._M_h._M_single_bucket = (__node_base_ptr)0x0;
      auStack_298 = (undefined1  [8])
                    ((long)&scanner.
                            super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
                            .super_Pass.name.field_2 + 8);
      for (p_Var33 = (__node_base_ptr)name.super_IString.str._M_str;
          p_Var33 != inlinedInto._M_h._M_single_bucket; p_Var33 = p_Var33 + 2) {
        auStack_c8 = (undefined1  [8])p_Var33->_M_nxt;
        name.super_IString.str._M_len = (size_t)p_Var33[1]._M_nxt;
        local_78 = Module::getFunction(this->module,(IString)*(IString *)&p_Var33->_M_nxt);
        sVar22 = std::
                 _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::count((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)auStack_298,(key_type *)local_78);
        if (sVar22 == 0) {
          pmVar23 = std::
                    unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                    ::operator[]((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                                  *)&state.worthInlining._M_h._M_single_bucket,
                                 (key_type *)auStack_c8);
          action = (pmVar23->
                   super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pIVar16 = (pmVar23->
                    super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          while( true ) {
            if (action == pIVar16) break;
            func_2 = action->contents;
            sVar24 = std::
                     _Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count((_Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              *)&state.actionsForFunction._M_h._M_single_bucket,&func_2);
            if (sVar24 == 0) {
              iterationCounts._M_h._M_single_bucket =
                   (__node_base_ptr)
                   (func_2->super_Importable).super_Named.name.super_IString.str._M_len;
              inlinedName.super_IString.str._M_len =
                   (size_t)(func_2->super_Importable).super_Named.name.super_IString.str._M_str;
              inlinedFunction =
                   (Function *)
                   (local_78->super_Importable).super_Named.name.super_IString.str._M_len;
              splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)(local_78->super_Importable).super_Named.name.super_IString.str._M_str;
              auStack_98 = (undefined1  [8])iterationCounts._M_h._M_single_bucket;
              pmVar19 = std::
                        unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                        ::operator[](this_00,(key_type *)&inlinedFunction);
              IVar1 = pmVar19->size;
              pmVar19 = std::
                        unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                        ::operator[](this_00,(key_type *)&iterationCounts._M_h._M_single_bucket);
              if ((double)(IVar1 + pmVar19->size) * 2.5 < 409600.0) {
                pFVar28 = action->contents;
                pmVar19 = std::
                          unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                          ::operator[](this_00,(key_type *)pFVar28);
                pPVar38 = (this->super_Pass).runner;
                bVar18 = FunctionInfo::worthInlining(pmVar19,&pPVar38->options);
                if (!bVar18) {
                  pFVar15 = (this->functionSplitter)._M_t.
                            super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                            .
                            super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>
                            ._M_head_impl;
                  if (pFVar15 == (FunctionSplitter *)0x0) {
                    __assert_fail("functionSplitter",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Inlining.cpp"
                                  ,0x460,
                                  "Function *wasm::(anonymous namespace)::Inlining::getActuallyInlinedFunction(Function *)"
                                 );
                  }
                  inlinedFunction = (Function *)0x0;
                  bVar18 = FunctionSplitter::maybeSplit(pFVar15,pFVar28,&inlinedFunction);
                  if (!bVar18 || inlinedFunction == (Function *)0x0) {
                    __assert_fail("success && inlineable",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Inlining.cpp"
                                  ,0x22f,
                                  "Function *wasm::(anonymous namespace)::FunctionSplitter::getInlineableSplitFunction(Function *)"
                                 );
                  }
                  pPVar38 = (this->super_Pass).runner;
                  pFVar28 = inlinedFunction;
                }
                action->contents = pFVar28;
                doInlining(this->module,local_78,action,&pPVar38->options);
                pmVar25 = std::__detail::
                          _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)auStack_298,(key_type *)auStack_98);
                *pmVar25 = *pmVar25 + 1;
                std::__detail::
                _Insert_base<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::insert((_Insert_base<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)&state.actionsForFunction._M_h._M_single_bucket,&local_78);
                pmVar25 = std::__detail::
                          _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)auStack_298,(key_type *)auStack_98);
                uVar2 = *pmVar25;
                pmVar19 = std::
                          unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                          ::operator[](this_00,(key_type *)auStack_98);
                if ((pmVar19->refs).super___atomic_base<unsigned_int>._M_i < uVar2) {
                  __assert_fail("inlinedUses[inlinedName] <= infos[inlinedName].refs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Inlining.cpp"
                                ,0x432,
                                "void wasm::(anonymous namespace)::Inlining::iteration(std::unordered_set<Function *> &)"
                               );
                }
              }
            }
            action = action + 1;
          }
        }
      }
      if ((this->optimize == true) &&
         (inlinedInto._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0)) {
        OptUtils::optimizeAfterInlining
                  ((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                    *)&state.actionsForFunction._M_h._M_single_bucket,this->module,
                   (this->super_Pass).runner);
      }
      splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Inlining.cpp:1081:29)>
                    ::_M_invoke;
      splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)std::
                    _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Inlining.cpp:1081:29)>
                    ::_M_manager;
      inlinedFunction = (Function *)this;
      splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)auStack_298;
      Module::removeFunctions(this->module,(function<bool_(wasm::Function_*)> *)&inlinedFunction);
      std::_Function_base::~_Function_base((_Function_base *)&inlinedFunction);
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)auStack_298);
      std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
                ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)
                 &name.super_IString.str._M_str);
    }
    InliningState::~InliningState((InliningState *)&scanner.infos);
    psVar29 = &inlinedInto._M_h._M_bucket_count;
    bVar18 = true;
    if (inlinedInto._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      while (psVar29 = (size_type *)*psVar29, psVar29 != (size_type *)0x0) {
        EHUtils::handleBlockNestedPops
                  ((Function *)((__node_base *)(psVar29 + 1))->_M_nxt,this->module);
      }
      psVar29 = &inlinedInto._M_h._M_bucket_count;
LAB_00873b61:
      psVar29 = (size_type *)*psVar29;
      if (psVar29 != (size_type *)0x0) goto code_r0x00873b69;
      pFVar15 = (this->functionSplitter)._M_t.
                super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                .super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>.
                _M_head_impl;
      if (pFVar15 == (FunctionSplitter *)0x0) goto LAB_00873cb8;
      splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      inlinedFunction = (Function *)0x0;
      splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      auStack_298 = (undefined1  [8])
                    ((long)&scanner.
                            super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
                            .super_Pass.name.field_2 + 8);
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass._vptr_Pass = (_func_int **)0x1;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.runner = (PassRunner *)0x0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.name._M_dataplus._M_p = (pointer)0x0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.name._M_string_length._0_4_ = 0x3f800000;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.name.field_2._M_allocated_capacity = 0;
      scanner.
      super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
      .super_Pass.name.field_2._8_8_ = 0;
      p_Var39 = &(pFVar15->splits)._M_h._M_before_begin;
      while (p_Var39 = p_Var39->_M_nxt, p_Var39 != (__node_base *)0x0) {
        if (*(value_type **)(p_Var39 + 4) != (value_type *)0x0) {
          std::__detail::
          _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)auStack_298,*(value_type **)(p_Var39 + 4));
          std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                    ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&inlinedFunction,
                     (value_type *)(p_Var39 + 1));
        }
      }
      state.worthInlining._M_h._M_buckets = (__buckets_ptr)0x0;
      state.worthInlining._M_h._M_before_begin._M_nxt =
           (_Hash_node_base *)
           std::
           _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Inlining.cpp:578:29)>
           ::_M_invoke;
      state.worthInlining._M_h._M_bucket_count =
           (size_type)
           std::
           _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Inlining.cpp:578:29)>
           ::_M_manager;
      scanner.infos = (NameInfoMap *)auStack_298;
      Module::removeFunctions(pFVar15->module,(function<bool_(wasm::Function_*)> *)&scanner.infos);
      std::_Function_base::~_Function_base((_Function_base *)&scanner.infos);
      std::
      _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)auStack_298);
      pNVar17 = splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start;
      pFVar28 = inlinedFunction;
      do {
        pFVar21 = pFVar28;
        if (pFVar21 == (Function *)pNVar17) {
          bVar18 = false;
          goto LAB_00873caa;
        }
        auStack_298 = (undefined1  [8])
                      (pFVar21->super_Importable).super_Named.name.super_IString.str._M_len;
        scanner.
        super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
        .super_Pass._vptr_Pass =
             (_func_int **)(pFVar21->super_Importable).super_Named.name.super_IString.str._M_str;
        pmVar25 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_2e0,(key_type *)auStack_298);
        mVar3 = *pmVar25;
        *pmVar25 = mVar3 + 1;
        pFVar28 = (Function *)&(pFVar21->super_Importable).super_Named.hasExplicitName;
      } while (mVar3 + 1 < 5);
      bVar18 = true;
LAB_00873caa:
      std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
                ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)&inlinedFunction);
      if (pFVar21 != (Function *)pNVar17) goto LAB_00873cbb;
LAB_00873cb8:
      bVar18 = false;
    }
    goto LAB_00873cbb;
  }
  goto LAB_00873cd7;
code_r0x00873b69:
  pmVar25 = std::__detail::
            _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)local_2e0,(key_type *)((__node_base *)(psVar29 + 1))->_M_nxt);
  mVar3 = *pmVar25;
  *pmVar25 = mVar3 + 1;
  if (4 < mVar3 + 1) goto code_r0x00873b80;
  goto LAB_00873b61;
code_r0x00873b80:
  bVar18 = true;
LAB_00873cbb:
  std::
  _Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&state.actionsForFunction._M_h._M_single_bucket);
  if (bVar18) {
LAB_00873cd7:
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_2e0);
    return;
  }
  goto LAB_008733b7;
}

Assistant:

void run(Module* module_) override {
    module = module_;

    // No point to do more iterations than the number of functions, as it means
    // we are infinitely recursing (which should be very rare in practice, but
    // it is possible that a recursive call can look like it is worth inlining).
    Index iterationNumber = 0;

    auto numOriginalFunctions = module->functions.size();

    // Track in how many iterations a function was inlined into. We are willing
    // to inline many times into a function within an iteration, as e.g. that
    // helps the case of many calls of a small getter. However, if we only do
    // more inlining in separate iterations then it is likely code that was the
    // result of previous inlinings that is now being inlined into. That is, an
    // old inlining added a call to somewhere, and now we are inlining into that
    // call. This is typically recursion, which to some extent can help, but
    // then like loop unrolling it loses its benefit quickly, so set a limit
    // here.
    //
    // In addition to inlining into a function, we track how many times we do
    // other potentially repetitive operations like splitting a function before
    // inlining, as any such repetitive operation should be limited in how many
    // times we perform it. (An exception is how many times we inlined a
    // function, which we do not want to limit - it can be profitable to inline
    // a call into a great many callsites, over many iterations.)
    //
    // (Track names here, and not Function pointers, as we can remove functions
    // while inlining, and it may be confusing during debugging to have a
    // pointer to something that was removed.)
    std::unordered_map<Name, Index> iterationCounts;

    const size_t MaxIterationsForFunc = 5;

    while (iterationNumber <= numOriginalFunctions) {
#ifdef INLINING_DEBUG
      std::cout << "inlining loop iter " << iterationNumber
                << " (numFunctions: " << module->functions.size() << ")\n";
#endif
      iterationNumber++;

      std::unordered_set<Function*> inlinedInto;

      prepare();
      iteration(inlinedInto);

      if (inlinedInto.empty()) {
        return;
      }

#ifdef INLINING_DEBUG
      std::cout << "  inlined into " << inlinedInto.size() << " funcs.\n";
#endif

      for (auto* func : inlinedInto) {
        EHUtils::handleBlockNestedPops(func, *module);
      }

      for (auto* func : inlinedInto) {
        if (++iterationCounts[func->name] >= MaxIterationsForFunc) {
          return;
        }
      }

      if (functionSplitter) {
        auto splitNames = functionSplitter->finish();
        for (auto name : splitNames) {
          if (++iterationCounts[name] >= MaxIterationsForFunc) {
            return;
          }
        }
      }
    }
  }